

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint v;
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong in_RAX;
  ulong uVar4;
  char *pcVar5;
  uint8_t zero;
  undefined8 uStack_28;
  
  pcVar5 = *(char **)((long)ud + 0x10);
  uVar4 = *(long *)((long)ud + 8) - (long)pcVar5;
  uVar3 = (uint)uVar4;
  uStack_28 = in_RAX;
  if ((uVar4 & 0xfffffc00) == 0) {
    lj_buf_need2((SBuf *)ud,0x400);
    pcVar5 = *(char **)((long)ud + 0x10);
    uVar3 = (int)*(undefined8 *)((long)ud + 8) - (int)pcVar5;
  }
  lVar1 = *(long *)(*(long *)((long)ud + 0x20) + 0x40);
  v = *(uint *)(lVar1 + 0x14);
  if (uVar3 < v + 10) {
    pcVar5 = lj_buf_need2((SBuf *)ud,v + 10);
  }
  pcVar5[0] = '\x1b';
  pcVar5[1] = 'L';
  pcVar5[2] = 'J';
  pcVar5[3] = '\x02';
  pcVar5[4] = (*(int *)((long)ud + 0x38) != 0) * '\x02' |
              *(byte *)(*(long *)((long)ud + 0x20) + 0x3d) & 4 | 8;
  pcVar5 = pcVar5 + 5;
  if (*(int *)((long)ud + 0x38) == 0) {
    pcVar5 = lj_strfmt_wuleb128(pcVar5,v);
    memcpy(pcVar5,(void *)(lVar1 + 0x18),(ulong)v);
    pcVar5 = pcVar5 + v;
  }
  uVar2 = (**(code **)((long)ud + 0x28))
                    (*(ulong *)((long)ud + 0x18) & 0xfffffffffffffff8,
                     *(undefined8 *)((long)ud + 0x10),
                     (int)pcVar5 - (int)*(undefined8 *)((long)ud + 0x10),
                     *(undefined8 *)((long)ud + 0x30));
  *(undefined4 *)((long)ud + 0x3c) = uVar2;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x20));
  if (*(int *)((long)ud + 0x3c) == 0) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    uVar2 = (**(code **)((long)ud + 0x28))
                      (*(ulong *)((long)ud + 0x18) & 0xfffffffffffffff8,(long)&uStack_28 + 7,1,
                       *(undefined8 *)((long)ud + 0x30));
    *(undefined4 *)((long)ud + 0x3c) = uVar2;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}